

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
::readLPF(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pNVar5;
  pointer pnVar6;
  byte *pbVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long *plVar13;
  size_t sVar14;
  char *pcVar15;
  long lVar16;
  void *pvVar17;
  type prVar18;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *prVar19;
  SPxOut *pSVar20;
  undefined8 *puVar21;
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  NameSet *pNVar28;
  byte *pbVar29;
  data_type *o;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar30;
  byte *pbVar31;
  undefined8 unaff_R13;
  char *pcVar32;
  DIdxSet *this_00;
  long lVar33;
  byte bVar34;
  byte *pbVar35;
  long in_FS_OFFSET;
  char *pos;
  Rational val;
  NameSet *cnames;
  char *tmp;
  char *buf;
  NameSet *rnames;
  Rational pre_sign;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  vec;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  cset;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  row;
  type t;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  rset;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  emptycol;
  byte *local_25e8;
  byte *local_25e0;
  uint local_25d4;
  byte *local_25d0;
  ulong local_25c8;
  uint local_25bc;
  istream *local_25b8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_25b0;
  uint local_25a4;
  long local_25a0;
  int local_2594;
  NameSet *local_2590;
  data_type local_2588;
  uint local_2578;
  undefined1 local_2574;
  char local_2573;
  char local_2572;
  data_type local_2568;
  uint local_2558;
  undefined1 local_2554;
  char local_2553;
  byte local_2552;
  NameSet *local_2540;
  byte *local_2538;
  char *local_2530;
  byte *local_2528;
  uint local_251c;
  byte *local_2518;
  NameSet *local_2510;
  data_type local_2508;
  char local_24f3;
  char local_24f2;
  data_type local_24e8;
  char local_24d3;
  char local_24d2;
  longlong local_24c0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_24b8;
  data_type local_2498;
  char local_2483;
  char local_2482;
  uint local_2478;
  void *local_2470;
  char local_2463;
  char local_2462;
  DIdxSet *local_2450;
  NameSet *local_2448;
  longdouble local_2440;
  longdouble local_2434;
  double local_2428;
  double local_2420;
  data_type local_2418;
  char local_2403;
  char local_2402;
  uint local_23f8;
  void *local_23f0;
  char local_23e3;
  char local_23e2;
  data_type local_23d8;
  char local_23c3;
  char local_23c2;
  uint local_23b8;
  void *local_23b0;
  char local_23a3;
  char local_23a2;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_2390;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_22c8;
  data_type local_21e8;
  uint local_21d8;
  undefined2 local_21d4;
  char local_21d2;
  data_type local_21c8;
  uint local_21b8;
  undefined2 local_21b4;
  byte local_21b2;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_1e0;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_118;
  
  local_25b0 = this;
  local_2448 = p_rnames;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColSetBase(&local_2390,-1,-1);
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPRowSetBase(&local_1e0,-1,-1);
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColBase(&local_118,0);
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPRowBase(&local_22c8,0);
  local_24b8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *)0x0;
  local_24b8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memsize = 0;
  local_24b8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memused = 0;
  local_24b8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_0069d4a0;
  local_24b8.theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::allocMem(&local_24b8,8);
  local_21e8.la[0] = 1;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)&local_2588.ld,(longlong *)local_21e8.la,(type *)0x0);
  local_2528 = (byte *)0x0;
  local_2530 = (char *)0x0;
  local_2518 = (byte *)0x0;
  local_25e0 = (byte *)0x0;
  pNVar28 = p_cnames;
  if (p_cnames == (NameSet *)0x0) {
    local_2540 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_2540,1);
    pNVar28 = local_2540;
    NameSet::NameSet(local_2540,10000,-1,2.0,2.0);
  }
  local_2540 = pNVar28;
  NameSet::clear(pNVar28);
  pNVar28 = local_2448;
  if (local_2448 == (NameSet *)0x0) {
    local_2510 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_2510,1);
    pNVar28 = local_2510;
    NameSet::NameSet(local_2510,10000,-1,2.0,2.0);
  }
  local_2510 = pNVar28;
  NameSet::clear(pNVar28);
  clear(local_25b0);
  spx_alloc<char*>((char **)&local_2528,0x2000);
  spx_alloc<char*>(&local_2530,0x2000);
  spx_alloc<char*>((char **)&local_2518,0x2000);
  local_2420 = *(double *)(in_FS_OFFSET + -8);
  local_2428 = -local_2420;
  local_2434 = (longdouble)local_2428;
  local_2440 = (longdouble)local_2420;
  pbVar31 = (byte *)0x2000;
  local_251c = 0xffffff01;
  uVar25 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  local_2594 = 0;
  local_25a4 = 0;
  local_25bc = 0;
  local_25b8 = p_input;
  local_2590 = p_cnames;
  local_2450 = p_intvars;
LAB_0015f198:
  local_25d4 = (uint)uVar25;
LAB_0015f19f:
  local_25a0 = 0;
  sVar14 = 0;
  local_2538 = pbVar31;
  while( true ) {
    pbVar35 = local_2528;
    std::ios::widen((char)p_input->_vptr_basic_istream[-3] + (char)p_input);
    pbVar29 = (byte *)((int)pbVar31 + local_25a0);
    plVar13 = (long *)std::istream::getline
                                ((char *)p_input,(long)(pbVar35 + (int)sVar14),
                                 (char)pbVar29 - (char)sVar14);
    if ((*(byte *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) & 5) == 0) break;
    std::ios::clear((int)p_input->_vptr_basic_istream[-3] + (int)p_input);
    sVar14 = strlen((char *)local_2528);
    if ((local_25a0 + (int)pbVar31) - 1U != sVar14) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ELPFRD07 No \'End\' marker found",0x1e);
      pNVar28 = local_2590;
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      goto LAB_0016262a;
    }
    if (pbVar29 == (byte *)0x7fffdfff) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ELPFRD16 Line longer than INT_MAX",0x21);
      pNVar28 = local_2590;
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      goto LAB_0016278a;
    }
    lVar16 = local_25a0 + 0x2000;
    spx_realloc<char*>((char **)&local_2528,(int)local_2538 + (int)local_25a0 + 0x2000);
    local_25a0 = lVar16;
  }
  if ((byte *)0x8 < pbVar29) {
    iVar27 = (int)local_2538 + (int)local_25a0;
    spx_realloc<char*>(&local_2530,iVar27);
    spx_realloc<char*>((char **)&local_2518,iVar27);
  }
  local_25e8 = local_2528;
  local_25e0 = local_2528;
  pcVar15 = strchr((char *)local_2528,0x5c);
  if (pcVar15 != (char *)0x0) {
    *pcVar15 = '\0';
  }
  local_2594 = local_2594 + 1;
  local_25d0 = pbVar29;
  if (local_25bc == 0) {
    iVar27 = 0;
    uVar12 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "max[imize]"[lVar16];
      if (cVar3 == '[') {
        pcVar15 = "max[imize]" + (iVar27 + 1);
        lVar33 = 0;
        iVar26 = iVar27;
        local_25c8 = (ulong)uVar12;
        do {
          iVar27 = iVar26;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + (int)uVar12];
          iVar10 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar26 = iVar27 + 1;
        } while (iVar10 == "max[imize]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar12 = ((int)local_25c8 + (int)lVar2) - 2;
        p_input = local_25b8;
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[(int)uVar12];
          goto LAB_0015f737;
        }
        local_25c8 = CONCAT44(local_25c8._4_4_,(int)cVar3);
        bVar34 = local_25e8[(int)uVar12];
        iVar26 = tolower((int)(char)bVar34);
        if (iVar26 != (int)local_25c8) goto LAB_0015f671;
      }
      iVar27 = iVar27 + 1;
      uVar12 = uVar12 + 1;
    } while( true );
  }
  if (local_25bc == 1) {
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "s[ubject][   ]t[o]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "s[ubject][   ]t[o]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "s[ubject][   ]t[o]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_0015f640;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_0015f57a;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
  if (local_25bc == 2) {
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "s[ubject][   ]t[o]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "s[ubject][   ]t[o]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "s[ubject][   ]t[o]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_0015f848;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_0015f788;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
  goto LAB_0015fdef;
LAB_0015f671:
  if (cVar3 != '\0') {
LAB_0015f67a:
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "min[imize]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "min[imize]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "min[imize]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_0015f9b5;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_0015f9a3;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
LAB_0015f737:
  if (((0x20 < bVar34) || ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar34 - 0x3c))) goto LAB_0015f67a;
  local_25e8 = local_25e8 + (int)uVar12;
  local_25e0 = local_25e8;
  (*(local_25b0->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._vptr_ClassArray[0x45])(local_25b0,1);
  pbVar31 = local_25d0;
  goto LAB_0015ffcc;
LAB_0015f9a3:
  if (cVar3 != '\0') {
    local_25bc = 0;
    pbVar31 = local_25d0;
    p_input = local_25b8;
    goto LAB_001603d3;
  }
LAB_0015f9b5:
  p_input = local_25b8;
  if (((0x20 < bVar34) || ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar34 - 0x3c))) {
    local_25bc = 0;
    pbVar31 = local_25d0;
    goto LAB_001603d3;
  }
  local_25e8 = local_25e8 + iVar26;
  local_25e0 = local_25e8;
  (*(local_25b0->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._vptr_ClassArray[0x45])(local_25b0,0xffffffff);
  pbVar31 = local_25d0;
  goto LAB_0015ffcc;
LAB_0015f57a:
  if (cVar3 != '\0') {
LAB_0015f583:
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "s[uch][    ]t[hat]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "s[uch][    ]t[hat]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "s[uch][    ]t[hat]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_0015f972;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_0015f8ac;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
LAB_0015f640:
  lVar16 = (long)iVar26;
  if (((0x20 < bVar34) || ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar34 - 0x3c))) goto LAB_0015f583;
  goto LAB_0015fc5a;
LAB_0015f8ac:
  if (cVar3 != '\0') {
LAB_0015f8b5:
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "s[.][    ]t[.]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "s[.][    ]t[.]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "s[.][    ]t[.]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_0015fc30;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_0015fb6a;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
LAB_0015f972:
  lVar16 = (long)iVar26;
  if (((0x20 < bVar34) || ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar34 - 0x3c))) goto LAB_0015f8b5;
  goto LAB_0015fc5a;
LAB_0015fb6a:
  if (cVar3 != '\0') {
LAB_0015fb73:
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "lazy con[straints]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "lazy con[straints]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "lazy con[straints]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_001604ad;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_00160499;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
LAB_0015fc30:
  lVar16 = (long)iVar26;
  if (((0x20 < bVar34) || ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar34 - 0x3c))) goto LAB_0015fb73;
LAB_0015fc5a:
  iVar27 = local_24b8.
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           .memused + 1;
  lVar33 = (ulong)(uint)local_24b8.
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        .memused * 0x50;
  local_25e0 = local_25e8 + lVar16;
  while( true ) {
    pNVar5 = local_24b8.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             .m_elem;
    iVar27 = iVar27 + -1;
    if (iVar27 < 1) break;
    pcVar30 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)(local_2390.object.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 *(int *)((long)&local_24b8.
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                 .m_elem[-1].idx + lVar33));
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar30,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)((long)&local_24b8.
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                .m_elem[-1].val.m_backend.m_value.num.m_backend.
                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                .m_data + lVar33));
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar30 + 1,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)((long)&pNVar5[-1].val.m_backend.m_value.den.m_backend.
                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        .m_data + lVar33));
    lVar33 = lVar33 + -0x50;
  }
  local_24b8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ._8_8_ = local_24b8.
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           ._8_8_ & 0xffffffff;
  local_21e8.la[0] = 1;
  prVar18 = boost::
            rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                         *)&local_2588.ld,(longlong *)local_21e8.la);
  local_25d4 = (uint)CONCAT71((int7)((ulong)prVar18 >> 8),1);
  pbVar31 = local_25d0;
  p_input = local_25b8;
  pbVar29 = local_25e8 + lVar16;
  goto LAB_0015fcf9;
LAB_00160499:
  pbVar31 = local_25d0;
  p_input = local_25b8;
  if (cVar3 == '\0') {
LAB_001604ad:
    lVar16 = (long)iVar26;
    if (((bVar34 < 0x21) && ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) != 0)) ||
       (pbVar31 = local_25d0, p_input = local_25b8, (byte)(bVar34 - 0x3c) < 3)) goto LAB_0015fc5a;
  }
LAB_0015ffcc:
  pcVar15 = strchr((char *)local_25e8,0x3a);
  local_25bc = 1;
  if (pcVar15 != (char *)0x0) {
    uVar12 = (int)pcVar15 - (int)local_25e8;
    uVar25 = (ulong)uVar12;
    do {
      if ((int)uVar25 < 1) break;
      lVar16 = uVar25 - 1;
      uVar25 = uVar25 - 1;
    } while (local_25e8[lVar16] == 0x20);
    local_25e0 = local_25e8 + (int)(uVar12 + 1);
  }
LAB_001603d3:
  lVar16 = 0;
  pbVar29 = local_25e0;
  while( true ) {
    pbVar29 = pbVar29 + 1;
    uVar25 = (ulong)local_25e0[lVar16];
    if ((0x20 < uVar25) || ((0x100002600U >> (uVar25 & 0x3f) & 1) == 0)) break;
    lVar16 = lVar16 + 1;
  }
  iVar27 = 0;
LAB_00160404:
  if ((byte)uVar25 < 0x21) {
    if ((0x100002600U >> (uVar25 & 0x3f) & 1) == 0) {
      if (uVar25 != 0) goto LAB_0016044c;
      local_2530[iVar27] = '\0';
      if (*local_2530 != '\0') goto LAB_00160654;
      goto LAB_0015f19f;
    }
    bVar34 = *pbVar29;
    if ((bVar34 != 0) &&
       (((byte)((bVar34 & 0xdf) + 0xbf) < 0x1a ||
        (pvVar17 = memchr("!\"#$%&()/,;?@_\'`{}|~",(int)(char)bVar34,0x15), pvVar17 != (void *)0x0))
       )) goto LAB_0016044c;
  }
  else {
LAB_0016044c:
    lVar16 = (long)iVar27;
    iVar27 = iVar27 + 1;
    local_2530[lVar16] = (byte)uVar25;
  }
  uVar25 = (ulong)*pbVar29;
  pbVar29 = pbVar29 + 1;
  goto LAB_00160404;
LAB_0015f788:
  if (cVar3 != '\0') {
LAB_0015f791:
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "s[uch][    ]t[hat]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "s[uch][    ]t[hat]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "s[uch][    ]t[hat]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_0015facb;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_0015fa0b;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
LAB_0015f848:
  lVar16 = (long)iVar26;
  if (((0x20 < bVar34) || ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar34 - 0x3c))) goto LAB_0015f791;
  goto LAB_0015fb02;
LAB_0015fa0b:
  if (cVar3 != '\0') {
LAB_0015fa14:
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "s[.][    ]t[.]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "s[.][    ]t[.]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "s[.][    ]t[.]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_00160147;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_0015fde1;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
LAB_0015facb:
  lVar16 = (long)iVar26;
  if (((0x20 < bVar34) || ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar34 - 0x3c))) goto LAB_0015fa14;
  goto LAB_0015fb02;
LAB_0015fde1:
  if (cVar3 != '\0') {
LAB_0015fdef:
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "lazy con[straints]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "lazy con[straints]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "lazy con[straints]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_0015ff77;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_0015feb7;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
LAB_00160147:
  lVar16 = (long)iVar26;
  if (((0x20 < bVar34) || ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar34 - 0x3c))) goto LAB_0015fdef;
LAB_0015fb02:
  p_input = local_25b8;
  local_21e8.la[0] = 1;
  local_25e0 = local_25e8 + lVar16;
  prVar18 = boost::
            rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                         *)&local_2588.ld,(longlong *)local_21e8.la);
  local_25d4 = (uint)CONCAT71((int7)((ulong)prVar18 >> 8),1);
  pbVar31 = local_25d0;
  pbVar29 = local_25e8 + lVar16;
LAB_0015fcf9:
  pNVar28 = local_2510;
  pcVar15 = strchr((char *)pbVar29,0x3a);
  local_25bc = 2;
  if (pcVar15 != (char *)0x0) {
    iVar27 = (int)((long)pcVar15 - (long)pbVar29);
    uVar12 = ~(uint)pbVar29 + (int)pcVar15;
    uVar25 = (long)pcVar15 - (long)pbVar29 & 0xffffffff;
    do {
      if ((int)uVar25 < 1) {
        local_25e0 = pbVar29 + (iVar27 + 1);
        goto LAB_001603d3;
      }
      uVar24 = (ulong)uVar12;
      uVar1 = uVar25 - 1;
      uVar12 = uVar12 - 1;
      lVar16 = uVar25 - 1;
      uVar25 = uVar1;
    } while (pbVar29[lVar16] == 0x20);
    if (uVar1 == 0) {
      iVar26 = -1;
    }
    else {
      do {
        iVar26 = (int)uVar24;
        uVar24 = (ulong)(iVar26 - 1U);
        if (pbVar29[uVar24] == 0x20) {
          iVar26 = iVar26 + -1;
          goto LAB_0015fd7d;
        }
      } while (0 < (int)(iVar26 - 1U));
      iVar26 = iVar26 + -2;
    }
LAB_0015fd7d:
    if (iVar26 < (int)uVar1) {
      uVar25 = 0;
      do {
        *(byte *)((long)&local_21e8 + uVar25) = pbVar29[iVar26 + (int)uVar25 + 1];
        uVar25 = uVar25 + 1;
      } while (iVar26 + (int)uVar25 < (int)uVar1);
      uVar25 = uVar25 & 0xffffffff;
    }
    else {
      uVar25 = 0;
    }
    *(undefined1 *)((long)&local_21e8 + uVar25) = 0;
    if (pNVar28 != (NameSet *)0x0) {
      NameSet::add(pNVar28,(char *)local_21e8.la);
    }
    local_25e0 = pbVar29 + (iVar27 + 1);
    local_251c = 0;
  }
  goto LAB_001603d3;
LAB_0015feb7:
  if (cVar3 != '\0') {
LAB_0015fec0:
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "bound[s]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "bound[s]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "bound[s]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_001600f8;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_00160038;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
LAB_0015ff77:
  if (((0x20 < bVar34) || ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar34 - 0x3c))) goto LAB_0015fec0;
  local_25e0 = local_25e8 + iVar26;
  pbVar31 = local_25d0;
  p_input = local_25b8;
  goto LAB_0015ffb0;
LAB_00160038:
  if (cVar3 == '\0') {
LAB_001600f8:
    if (((bVar34 < 0x21) && ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) != 0)) ||
       ((byte)(bVar34 - 0x3c) < 3)) {
      local_25e0 = local_25e8 + iVar26;
      local_25bc = 3;
      pbVar31 = local_25d0;
      p_input = local_25b8;
      goto LAB_001603d3;
    }
  }
  iVar27 = 0;
  uVar25 = 0;
  do {
    lVar16 = (long)iVar27;
    cVar3 = "bin[ary]"[lVar16];
    iVar26 = (int)uVar25;
    if (cVar3 == '[') {
      pcVar15 = "bin[ary]" + (iVar27 + 1);
      lVar33 = 0;
      iVar10 = iVar27;
      local_25c8 = uVar25;
      do {
        iVar27 = iVar10;
        pcVar32 = pcVar15;
        bVar34 = local_25e8[lVar33 + iVar26];
        iVar11 = tolower((int)(char)bVar34);
        lVar2 = lVar33 + 1;
        if (bVar34 == 0) break;
        lVar4 = lVar33 + lVar16 + 1;
        pcVar15 = pcVar32 + 1;
        lVar33 = lVar2;
        iVar10 = iVar27 + 1;
      } while (iVar11 == "bin[ary]"[lVar4]);
      do {
        iVar27 = iVar27 + 1;
        cVar3 = *pcVar32;
        pcVar32 = pcVar32 + 1;
      } while (cVar3 != ']');
      uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
    }
    else {
      if (cVar3 == '\0') {
        bVar34 = local_25e8[iVar26];
        goto LAB_0016024f;
      }
      bVar34 = local_25e8[iVar26];
      iVar10 = tolower((int)(char)bVar34);
      if (iVar10 != cVar3) break;
    }
    iVar27 = iVar27 + 1;
    uVar25 = (ulong)((int)uVar25 + 1);
  } while( true );
  if (cVar3 != '\0') {
LAB_00160198:
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "bin[aries]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "bin[aries]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "bin[aries]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_00160392;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_001602d2;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
LAB_0016024f:
  lVar16 = (long)iVar26;
  if (((0x20 < bVar34) || ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar34 - 0x3c))) goto LAB_00160198;
  goto LAB_001603b4;
LAB_001602d2:
  if (cVar3 != '\0') {
LAB_001602db:
    iVar27 = 0;
    uVar25 = 0;
    do {
      lVar16 = (long)iVar27;
      cVar3 = "gen[erals]"[lVar16];
      iVar26 = (int)uVar25;
      if (cVar3 == '[') {
        pcVar15 = "gen[erals]" + (iVar27 + 1);
        lVar33 = 0;
        iVar10 = iVar27;
        local_25c8 = uVar25;
        do {
          iVar27 = iVar10;
          pcVar32 = pcVar15;
          bVar34 = local_25e8[lVar33 + iVar26];
          iVar11 = tolower((int)(char)bVar34);
          lVar2 = lVar33 + 1;
          if (bVar34 == 0) break;
          lVar4 = lVar33 + lVar16 + 1;
          pcVar15 = pcVar32 + 1;
          lVar33 = lVar2;
          iVar10 = iVar27 + 1;
        } while (iVar11 == "gen[erals]"[lVar4]);
        do {
          iVar27 = iVar27 + 1;
          cVar3 = *pcVar32;
          pcVar32 = pcVar32 + 1;
        } while (cVar3 != ']');
        uVar25 = (ulong)(((int)local_25c8 + (int)lVar2) - 2);
      }
      else {
        if (cVar3 == '\0') {
          bVar34 = local_25e8[iVar26];
          goto LAB_0016053f;
        }
        bVar34 = local_25e8[iVar26];
        iVar10 = tolower((int)(char)bVar34);
        if (iVar10 != cVar3) goto LAB_00160510;
      }
      iVar27 = iVar27 + 1;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while( true );
  }
LAB_00160392:
  lVar16 = (long)iVar26;
  if (((0x20 < bVar34) || ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar34 - 0x3c))) goto LAB_001602db;
LAB_001603b4:
  local_25e0 = local_25e8 + lVar16;
  local_25bc = 5;
  pbVar31 = local_25d0;
  p_input = local_25b8;
  goto LAB_001603d3;
LAB_00160510:
  if (cVar3 == '\0') {
LAB_0016053f:
    if (((bVar34 < 0x21) && ((0x100002601U >> ((ulong)bVar34 & 0x3f) & 1) != 0)) ||
       ((byte)(bVar34 - 0x3c) < 3)) {
      local_25e0 = local_25e8 + iVar26;
      local_25bc = 4;
      pbVar31 = local_25d0;
      p_input = local_25b8;
      goto LAB_001603d3;
    }
  }
  bVar9 = LPFhasKeyword((char **)&local_25e0,"int[egers]");
  p_input = local_25b8;
  if (bVar9) {
    local_25bc = 4;
    pbVar31 = local_25d0;
    goto LAB_001603d3;
  }
  bVar9 = LPFhasKeyword((char **)&local_25e0,"end");
  pbVar31 = local_25d0;
  pNVar28 = local_2590;
  if (bVar9) {
LAB_0016262a:
    (*(local_25b0->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[0xd])(local_25b0,&local_2390,0);
    (*(local_25b0->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[8])(local_25b0,&local_1e0,0);
    pSVar20 = local_25b0->spxout;
    bVar34 = 1;
    if ((pSVar20 != (SPxOut *)0x0) && (3 < (int)pSVar20->m_verbosity)) {
      local_21e8.ld.capacity = pSVar20->m_verbosity;
      local_2508.ld.capacity = 4;
      (*pSVar20->_vptr_SPxOut[2])();
      pSVar20 = local_25b0->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity],"Finished reading ",0x11);
      std::ostream::operator<<((ostream *)pSVar20->m_streams[pSVar20->m_verbosity],local_2594);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity]," lines",6);
      cVar3 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      (*local_25b0->spxout->_vptr_SPxOut[2])(local_25b0->spxout,&local_21e8);
    }
    goto LAB_001627de;
  }
  bVar9 = LPFhasKeyword((char **)&local_25e0,"s[ubject][   ]t[o]");
  if (((bVar9) || (bVar9 = LPFhasKeyword((char **)&local_25e0,"s[uch][    ]t[hat]"), bVar9)) ||
     ((bVar9 = LPFhasKeyword((char **)&local_25e0,"s[.][    ]t[.]"), bVar9 ||
      (bVar9 = LPFhasKeyword((char **)&local_25e0,"lazy con[straints]"), bVar9)))) {
    pNVar28 = local_2590;
    if ((local_25d4 & 1) != 0) goto LAB_0016278a;
    local_21e8.la[0] = 1;
    prVar18 = boost::
              rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
              ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                           *)&local_2588.ld,(longlong *)local_21e8.la);
    local_25d4 = (uint)CONCAT71((int7)((ulong)prVar18 >> 8),1);
  }
LAB_0015ffb0:
  pbVar29 = local_25e0;
  if (local_25bc != 2) {
    if (local_25bc != 1) goto LAB_001603d3;
    local_25e8 = local_25e0;
    goto LAB_0015ffcc;
  }
  goto LAB_0015fcf9;
LAB_00160654:
  pbVar31 = (byte *)((int)local_2538 + local_25a0);
  uVar25 = 0;
  iVar27 = 0;
  do {
    lVar16 = (long)iVar27;
    while (((bVar34 = local_2530[lVar16], bVar34 == 0x2d || (bVar34 == 0x2b)) &&
           ((cVar3 = local_2530[lVar16 + 1], cVar3 == '-' || (cVar3 == '+'))))) {
      lVar16 = lVar16 + 1;
      if (bVar34 == 0x2d) {
        local_2530[lVar16] = (cVar3 != '-') * '\x02' + '+';
      }
    }
    local_2518[uVar25] = bVar34;
    uVar25 = uVar25 + 1;
    iVar27 = (int)lVar16 + 1;
  } while (local_2530[iVar27] != '\0');
  local_2518[uVar25 & 0xffffffff] = 0;
  local_25e0 = local_2518;
  pbVar29 = local_2518;
  pbVar35 = local_2518;
  local_25d0 = pbVar31;
LAB_001606f0:
  local_25e8 = pbVar35;
  local_25a0 = CONCAT44(local_25a0._4_4_,local_25a4);
  local_2538 = local_25e8;
LAB_00160700:
  uVar25 = (ulong)local_25d4;
  pbVar7 = local_2538;
  while( true ) {
    pbVar35 = pbVar7;
    pbVar7 = local_2538;
    if ((pbVar35 == (byte *)0x0) || (bVar34 = *pbVar35, bVar34 == 0)) {
      local_25a4 = (uint)local_25a0;
      goto LAB_0015f198;
    }
    if (local_25bc != 1) break;
    if (((byte)(bVar34 - 0x30) < 10) ||
       ((bVar34 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar34 & 0x3f) & 1) != 0)))) {
      local_21e8.la[0] = 1;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_2508.ld,(longlong *)local_21e8.la,(type *)0x0);
      if ((uVar25 & 1) == 0) {
LAB_001609c5:
        LPFreadValue((Rational *)&local_21e8.ld,(char **)&local_25e0,local_25b0->spxout,local_2594);
        if ((local_2573 == '\0') && (local_2572 == '\0')) {
          operator_delete(local_2588.ld.data,(local_2588.la[0] & 0xffffffff) << 3);
        }
        local_2578 = local_21d8;
        local_2574 = (undefined1)local_21d4;
        local_2573 = local_21d4._1_1_;
        local_2572 = local_21d2;
        if (local_21d4._1_1_ == '\x01') {
          memcpy(&local_2588,&local_21e8,(ulong)local_21d8 << 3);
        }
        else {
          local_2588.la[0] = local_21e8.la[0];
          local_2588.ld.data = local_21e8.ld.data;
          local_21d8 = 0;
          local_21d4 = CONCAT11(1,(undefined1)local_21d4);
        }
        if ((local_2553 == '\0') && (local_2552 == 0)) {
          operator_delete(local_2568.ld.data,(local_2568.la[0] & 0xffffffff) << 3);
        }
        bVar34 = local_21b2;
        local_2558 = local_21b8;
        local_2554 = (undefined1)local_21b4;
        cVar3 = local_21b4._1_1_;
        local_2553 = local_21b4._1_1_;
        uVar12 = (uint)local_21b2;
        local_2552 = local_21b2;
        if (local_21b4._1_1_ == '\0') {
          local_2568.la[0] = local_21c8.la[0];
          local_2568.ld.data = local_21c8.ld.data;
          local_21b8 = 0;
          local_21b4 = CONCAT11(1,(undefined1)local_21b4);
          pbVar31 = local_25d0;
        }
        else {
          memcpy(&local_2568,&local_21c8,(ulong)local_21b8 << 3);
          pbVar31 = local_25d0;
          if ((cVar3 == '\0') && (bVar34 == 0)) {
            operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
          }
        }
        if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
          operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
        }
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)&local_2588.ld,
                     (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)&local_2508.ld);
        iVar27 = 0;
        uVar25 = CONCAT71((int7)(uVar25 >> 8),1);
      }
      else {
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_23d8.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2588.ld);
        local_21e8.la[0] = (limb_type)&local_24c0;
        local_21e8.ld.data = (limb_pointer)&local_23d8;
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2498.ld,
                   (expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>_>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_21e8.ld,(type *)0x0);
        local_24c0 = 1;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_21e8.ld,&local_24c0,(type *)0x0);
        uVar12 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2498.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_21e8.ld);
        if ((local_21b4._1_1_ == '\0') && (local_21b2 == 0)) {
          operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
        }
        if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
          operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
        }
        if ((local_2463 == '\0') && (local_2462 == '\0')) {
          operator_delete(local_2470,(ulong)local_2478 << 3);
        }
        if ((local_2483 == '\0') && (local_2482 == '\0')) {
          operator_delete(local_2498.ld.data,(local_2498.la[0] & 0xffffffff) << 3);
        }
        if ((local_23a3 == '\0') && (local_23a2 == '\0')) {
          operator_delete(local_23b0,(ulong)local_23b8 << 3);
        }
        if ((local_23c3 == '\0') && (local_23c2 == '\0')) {
          operator_delete(local_23d8.ld.data,(ulong)local_23d8.ld.capacity << 3);
        }
        iVar27 = 6;
        if (uVar12 == 0) {
          local_2498.la[0] = 0xffffffffffffffff;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_21e8.ld,(longlong *)local_2498.la,(type *)0x0);
          iVar27 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_2588.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_21e8.ld);
          if ((local_21b4._1_1_ == '\0') && (local_21b2 == 0)) {
            operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
          }
          if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
            operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
          }
          if (iVar27 == 0) {
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2508.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2588.ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_24e8.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2568.ld);
          }
          goto LAB_001609c5;
        }
      }
      bVar34 = (byte)uVar12;
      if ((local_24d3 == '\0') && (local_24d2 == '\0')) {
        operator_delete(local_24e8.ld.data,(ulong)local_24e8.ld.capacity << 3);
      }
      if ((local_24f3 == '\0') && (local_24f2 == '\0')) {
        operator_delete(local_2508.ld.data,(local_2508.la[0] & 0xffffffff) << 3);
      }
      pbVar29 = local_25e0;
      if (iVar27 != 0) {
        pNVar28 = local_2590;
        if (iVar27 == 6) goto LAB_0016278a;
        goto LAB_0016285a;
      }
    }
    bVar34 = *pbVar29;
    pbVar7 = pbVar29;
    if (bVar34 != 0) {
      pNVar28 = local_2590;
      if (((uVar25 & 1) == 0) ||
         ((0x19 < (byte)((bVar34 & 0xdf) + 0xbf) &&
          (pvVar17 = memchr("!\"#$%&()/,;?@_\'`{}|~",(int)(char)bVar34,0x15), pNVar28 = local_2590,
          pvVar17 == (void *)0x0)))) goto LAB_0016278a;
      iVar27 = LPFreadColName((char **)&local_25e0,local_2540,&local_2390,&local_118,
                              local_25b0->spxout);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::add(&local_24b8,iVar27,
            (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)&local_2588.ld);
      local_25d4 = 0;
      local_25e8 = pbVar35;
      goto LAB_00161e5b;
    }
  }
  if (5 < local_25bc) {
switchD_00160c35_caseD_1:
    puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_21e8.la[0] = (limb_type)&local_21d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_21e8,"XLPFRD01 This should never happen.","");
    *puVar21 = &PTR__SPxException_0069d438;
    puVar21[1] = puVar21 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar21 + 1),local_21e8.la[0],(long)local_21e8.ld.data + local_21e8.la[0])
    ;
    *puVar21 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar21,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  uVar12 = (uint)bVar34;
  switch(local_25bc) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ELPFRD13 This seems to be no LP format file",0x2b);
    pNVar28 = local_2590;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    goto LAB_0016278a;
  case 1:
    goto switchD_00160c35_caseD_1;
  case 2:
    if (((byte)(bVar34 - 0x30) < 10) ||
       ((uVar12 < 0x2f && ((0x680000000000U >> ((ulong)uVar12 & 0x3f) & 1) != 0)))) {
      local_21e8.la[0] = 1;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_2508.ld,(longlong *)local_21e8.la,(type *)0x0);
      if ((local_25d4 & 1) == 0) {
LAB_001614e0:
        LPFreadValue((Rational *)&local_21e8.ld,(char **)&local_25e0,local_25b0->spxout,local_2594);
        if ((local_2573 == '\0') && (local_2572 == '\0')) {
          operator_delete(local_2588.ld.data,(local_2588.la[0] & 0xffffffff) << 3);
        }
        local_2578 = local_21d8;
        local_2574 = (undefined1)local_21d4;
        local_2573 = local_21d4._1_1_;
        local_2572 = local_21d2;
        if (local_21d4._1_1_ == '\x01') {
          memcpy(&local_2588,&local_21e8,(ulong)local_21d8 << 3);
        }
        else {
          local_2588.la[0] = local_21e8.la[0];
          local_2588.ld.data = local_21e8.ld.data;
          local_21d8 = 0;
          local_21d4 = CONCAT11(1,(undefined1)local_21d4);
        }
        if ((local_2553 == '\0') && (local_2552 == 0)) {
          operator_delete(local_2568.ld.data,(local_2568.la[0] & 0xffffffff) << 3);
        }
        bVar34 = local_21b2;
        local_2558 = local_21b8;
        local_2554 = (undefined1)local_21b4;
        cVar3 = local_21b4._1_1_;
        local_2553 = local_21b4._1_1_;
        o = (data_type *)(ulong)local_21b2;
        local_2552 = local_21b2;
        if (local_21b4._1_1_ == '\0') {
          local_2568.la[0] = local_21c8.la[0];
          local_2568.ld.data = local_21c8.ld.data;
          local_21b8 = 0;
          local_21b4 = CONCAT11(1,(undefined1)local_21b4);
          pbVar31 = local_25d0;
        }
        else {
          memcpy(&local_2568,&local_21c8,(ulong)local_21b8 << 3);
          pbVar31 = local_25d0;
          if ((cVar3 == '\0') && (bVar34 == 0)) {
            operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
          }
        }
        if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
          operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
        }
        prVar19 = boost::
                  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)&local_2588.ld,
                               (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)&local_2508.ld);
        uVar12 = local_25a4;
        if (local_25a4 != 0) {
          if (local_25a4 == 0x3e) {
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_22c8,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2588.ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_22c8.left.m_backend.m_value.den,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2568.ld);
            ::soplex::infinity::__tls_init();
            local_21e8.la[0] = 0;
            local_21d8 = 1;
            local_21d4 = 0x100;
            local_21d2 = '\0';
            local_21c8.la[0] = 1;
            local_21b8 = 1;
            local_21b4 = 0x100;
            local_21b2 = 0;
            o = &local_21e8;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                         *)&o->ld,local_2440);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_22c8.right,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&o->ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_22c8.right.m_backend.m_value.den,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_21c8.ld);
            if ((local_21b4._1_1_ == '\0') && (local_21b2 == 0)) {
              operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
            }
            if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
              operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
            }
          }
          else {
            if (local_25a4 == 0x3c) {
              ::soplex::infinity::__tls_init();
              local_21e8.la[0] = 0;
              local_21d8 = 1;
              local_21d4 = 0x100;
              local_21d2 = '\0';
              local_21c8.la[0] = 1;
              local_21b8 = 1;
              local_21b4 = 0x100;
              local_21b2 = 0;
              o = &local_21e8;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                           *)&o->ld,local_2434);
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_22c8,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&o->ld);
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_22c8.left.m_backend.m_value.den,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_21c8.ld);
              if ((local_21b4._1_1_ == '\0') && (local_21b2 == 0)) {
                operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
              }
              if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
                operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
              }
            }
            else {
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_22c8,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2588.ld);
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_22c8.left.m_backend.m_value.den,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2568.ld);
            }
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_22c8.right,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2588.ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_22c8.right.m_backend.m_value.den,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2568.ld);
          }
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=(&local_22c8.vec,&local_24b8);
          local_21e8.la[0] = 0xffffffff00000000;
          LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::add(&local_1e0,(DataKey *)&local_21e8.ld,&local_22c8);
          local_24b8.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ._8_8_ = local_24b8.
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   ._8_8_ & 0xffffffff;
          if ((local_251c & 1) != 0) {
            o = &local_21e8;
            spxSnprintf((char *)o->la,0x10,"C%d",
                        (ulong)(uint)local_1e0.
                                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     .set.thenum);
            NameSet::add(local_2510,(char *)o->la);
          }
          bVar34 = (byte)o;
          local_21e8.la[0] = 1;
          prVar18 = boost::
                    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                    ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                                 *)&local_2588.ld,(longlong *)local_21e8.la);
          local_25e0 = (byte *)0x0;
          uVar12 = 0x14;
          prVar19 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)CONCAT71((int7)((ulong)prVar18 >> 8),1);
          local_251c = (uint)prVar19;
          local_25a4 = 0;
        }
        local_25d4 = (uint)CONCAT71((int7)((ulong)prVar19 >> 8),1);
      }
      else {
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2418.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2588.ld);
        local_21e8.la[0] = (limb_type)&local_24c0;
        local_21e8.ld.data = (limb_pointer)&local_2418;
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2498.ld,
                   (expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>_>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_21e8.ld,(type *)0x0);
        local_24c0 = 1;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_21e8.ld,&local_24c0,(type *)0x0);
        iVar27 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2498.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_21e8.ld);
        bVar34 = (byte)iVar27;
        if ((local_21b4._1_1_ == '\0') && (local_21b2 == 0)) {
          operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
        }
        if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
          operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
        }
        if ((local_2463 == '\0') && (local_2462 == '\0')) {
          operator_delete(local_2470,(ulong)local_2478 << 3);
        }
        if ((local_2483 == '\0') && (local_2482 == '\0')) {
          operator_delete(local_2498.ld.data,(local_2498.la[0] & 0xffffffff) << 3);
        }
        if ((local_23e3 == '\0') && (local_23e2 == '\0')) {
          operator_delete(local_23f0,(ulong)local_23f8 << 3);
        }
        if ((local_2403 == '\0') && (local_2402 == '\0')) {
          operator_delete(local_2418.ld.data,(ulong)local_2418.ld.capacity << 3);
        }
        uVar12 = 6;
        if (iVar27 == 0) {
          local_2498.la[0] = 0xffffffffffffffff;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_21e8.ld,(longlong *)local_2498.la,(type *)0x0);
          iVar27 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_2588.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_21e8.ld);
          if ((local_21b4._1_1_ == '\0') && (local_21b2 == 0)) {
            operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
          }
          if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
            operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
          }
          if (iVar27 == 0) {
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2508.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2588.ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_24e8.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2568.ld);
          }
          goto LAB_001614e0;
        }
      }
      if ((local_24d3 == '\0') && (local_24d2 == '\0')) {
        operator_delete(local_24e8.ld.data,(ulong)local_24e8.ld.capacity << 3);
      }
      if ((local_24f3 == '\0') && (local_24f2 == '\0')) {
        operator_delete(local_2508.ld.data,(local_2508.la[0] & 0xffffffff) << 3);
      }
      pbVar29 = local_25e0;
      if (uVar12 != 0) {
        pbVar35 = local_25e0;
        if (uVar12 == 0x14) goto LAB_001606f0;
        pNVar28 = local_2590;
        if (uVar12 != 6) goto LAB_0016285a;
        goto LAB_0016278a;
      }
      bVar34 = *local_25e0;
      pbVar35 = local_25e0;
    }
    if (bVar34 == 0) goto LAB_001606f0;
    if ((local_25d4 & 1) == 0) goto LAB_00161e21;
    if ((0x19 < (byte)((bVar34 & 0xdf) + 0xbf)) &&
       (pvVar17 = memchr("!\"#$%&()/,;?@_\'`{}|~",(int)(char)bVar34,0x15), pvVar17 == (void *)0x0))
    {
      local_2508.la[0] = 1;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_21e8.ld,(longlong *)local_2508.la,(type *)0x0);
      iVar27 = boost::multiprecision::backends::
               rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_2588.ld,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_21e8.ld);
      if ((local_21b4._1_1_ == '\0') && (local_21b2 == 0)) {
        operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
      }
      if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
        operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
      }
      pNVar28 = local_2590;
      if ((iVar27 != 0) || (2 < (byte)(*pbVar35 - 0x3c))) goto LAB_0016278a;
      goto LAB_00161e0f;
    }
    iVar27 = LPFreadColName((char **)&local_25e0,local_2540,&local_2390,&local_118,
                            local_25b0->spxout);
    local_2508.la[0] = 0;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>
              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                *)&local_21e8.ld,(longlong *)local_2508.la,(type *)0x0);
    iVar26 = boost::multiprecision::backends::
             rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
             ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_2588.ld,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_21e8.ld);
    if ((local_21b4._1_1_ == '\0') && (local_21b2 == 0)) {
      operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
    }
    if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
      operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
    }
    if (iVar26 == 0) goto LAB_00161d60;
    if (local_24b8.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .m_elem ==
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         *)0x0) goto LAB_00161d4b;
    if ((long)local_24b8.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .memused < 1) goto LAB_00161d4b;
    pcVar15 = (char *)0x0;
    lVar16 = 0x40;
    lVar33 = 0;
    goto LAB_00161d2f;
  case 3:
    break;
  default:
    uVar12 = LPFreadColName((char **)&local_25e0,local_2540,&local_2390,
                            (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                             *)0x0,local_25b0->spxout);
    pnVar6 = local_2390.low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)uVar12 < 0) {
      pSVar20 = local_25b0->spxout;
      if ((pSVar20 != (SPxOut *)0x0) && (0 < (int)pSVar20->m_verbosity)) {
        local_21e8.ld.capacity = pSVar20->m_verbosity;
        local_2508.ld.capacity = 1;
        (*pSVar20->_vptr_SPxOut[2])(pSVar20,&local_2508);
        pSVar20 = local_25b0->spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar20->m_streams[pSVar20->m_verbosity],
                   "WLPFRD12 in Binary/General section line ",0x28);
        std::ostream::operator<<((ostream *)pSVar20->m_streams[pSVar20->m_verbosity],local_2594);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar20->m_streams[pSVar20->m_verbosity]," ignored",8);
        cVar3 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        (*local_25b0->spxout->_vptr_SPxOut[2])(local_25b0->spxout,&local_21e8);
      }
      goto LAB_00161e53;
    }
    this_00 = local_2450;
    if (local_25bc == 5) {
      local_2508.la[0] = 0;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_21e8.ld,(longlong *)local_2508.la,(type *)0x0);
      iVar27 = boost::multiprecision::backends::
               rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               ::compare(&pnVar6[uVar12].m_backend,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_21e8.ld);
      if ((local_21b4._1_1_ == '\0') && (local_21b2 == 0)) {
        operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
      }
      if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
        operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
      }
      if (iVar27 < 0) {
        local_21e8.la[0] = 0;
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
        ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                     *)(local_2390.low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar12),
                    (longlong *)local_21e8.la);
      }
      pnVar6 = local_2390.up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2508.la[0] = 1;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_21e8.ld,(longlong *)local_2508.la,(type *)0x0);
      iVar27 = boost::multiprecision::backends::
               rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               ::compare(&pnVar6[uVar12].m_backend,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_21e8.ld);
      if ((local_21b4._1_1_ == '\0') && (local_21b2 == 0)) {
        operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
      }
      if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
        operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
      }
      this_00 = local_2450;
      if (0 < iVar27) {
        local_21e8.la[0] = 1;
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
        ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                     *)(local_2390.up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar12),
                    (longlong *)local_21e8.la);
      }
    }
    if (this_00 == (DIdxSet *)0x0) goto LAB_00161e53;
    DIdxSet::addIdx(this_00,uVar12);
    local_25a0 = CONCAT44(local_25a0._4_4_,local_25a4);
    goto LAB_00161e5b;
  }
  if ((byte)(bVar34 - 0x30) < 10) {
LAB_00160c66:
    if ((((*local_2538 == 0x2d) || (*local_2538 == 0x2b)) &&
        (iVar27 = tolower((int)(char)local_2538[1]), iVar27 == 0x69)) &&
       ((iVar27 = tolower((int)(char)pbVar7[2]), iVar27 == 0x6e &&
        (iVar27 = tolower((int)(char)pbVar7[3]), iVar27 == 0x66)))) {
      LPFreadInfinity((Rational *)&local_21e8.ld,(char **)&local_25e0);
    }
    else {
      LPFreadValue((Rational *)&local_21e8.ld,(char **)&local_25e0,local_25b0->spxout,local_2594);
    }
    if ((local_2573 == '\0') && (local_2572 == '\0')) {
      operator_delete(local_2588.ld.data,(local_2588.la[0] & 0xffffffff) << 3);
    }
    local_2578 = local_21d8;
    local_2574 = (undefined1)local_21d4;
    local_2573 = local_21d4._1_1_;
    local_2572 = local_21d2;
    if (local_21d4._1_1_ == '\x01') {
      memcpy(&local_2588,&local_21e8,(ulong)local_21d8 << 3);
    }
    else {
      local_2588.la[0] = local_21e8.la[0];
      local_2588.ld.data = local_21e8.ld.data;
      local_21d8 = 0;
      local_21d4 = CONCAT11(1,(undefined1)local_21d4);
    }
    if ((local_2553 == '\0') && (local_2552 == 0)) {
      operator_delete(local_2568.ld.data,(local_2568.la[0] & 0xffffffff) << 3);
    }
    bVar34 = local_21b2;
    local_2558 = local_21b8;
    local_2554 = (undefined1)local_21b4;
    cVar3 = local_21b4._1_1_;
    local_2553 = local_21b4._1_1_;
    local_2552 = local_21b2;
    if (local_21b4._1_1_ == '\0') {
      local_2568.la[0] = local_21c8.la[0];
      local_2568.ld.data = local_21c8.ld.data;
      local_21b8 = 0;
      local_21b4 = CONCAT11(1,(undefined1)local_21b4);
    }
    else {
      memcpy(&local_2568,&local_21c8,(ulong)local_21b8 << 3);
      if ((cVar3 == '\0') && (bVar34 == 0)) {
        operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
      }
    }
    pbVar31 = local_25d0;
    if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
      operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
    }
    pbVar29 = local_25e0;
    bVar22 = *local_25e0;
    pNVar28 = local_2590;
    if (2 < (byte)(bVar22 - 0x3c)) goto LAB_0016278a;
    bVar34 = local_25e0[1];
    bVar8 = bVar34;
    if (((bVar34 == 0x3c) || (bVar34 == 0x3e)) ||
       (lVar16 = 1, bVar8 = bVar22, pbVar35 = local_25e0 + 1, bVar34 == 0x3d)) {
      bVar22 = bVar8;
      bVar34 = local_25e0[2];
      lVar16 = 2;
      pbVar35 = local_25e0 + 2;
    }
    local_25e0 = pbVar35;
    if ((bVar34 < 0x21) && ((0x100002600U >> ((ulong)bVar34 & 0x3f) & 1) != 0)) {
      local_25e0 = pbVar29 + lVar16 + 1;
      bVar34 = *local_25e0;
    }
    uVar23 = (uint)bVar22;
    bVar9 = true;
  }
  else {
    bVar9 = false;
    if (uVar12 < 0x2f) {
      uVar23 = 0;
      bVar9 = false;
      if ((0x680000000000U >> ((ulong)uVar12 & 0x3f) & 1) != 0) goto LAB_00160c66;
    }
    else {
      uVar23 = 0;
    }
  }
  pNVar28 = local_2590;
  if (bVar34 == 0) goto LAB_0016278a;
  local_25a0 = CONCAT44(local_25a0._4_4_,uVar23);
  if ((0x19 < (byte)((bVar34 & 0xdf) + 0xbf)) &&
     (pvVar17 = memchr("!\"#$%&()/,;?@_\'`{}|~",(int)(char)bVar34,0x15), pNVar28 = local_2590,
     pvVar17 == (void *)0x0)) goto LAB_0016278a;
  uVar12 = LPFreadColName((char **)&local_25e0,local_2540,&local_2390,
                          (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           *)0x0,local_25b0->spxout);
  if (-1 < (int)uVar12) goto LAB_00161eb6;
  pSVar20 = local_25b0->spxout;
  if ((pSVar20 != (SPxOut *)0x0) && (0 < (int)pSVar20->m_verbosity)) {
    local_21e8.ld.capacity = pSVar20->m_verbosity;
    local_2508.ld.capacity = 1;
    (*pSVar20->_vptr_SPxOut[2])(pSVar20,&local_2508);
    pSVar20 = local_25b0->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar20->m_streams[pSVar20->m_verbosity],"WLPFRD11 in Bounds section line ",0x20);
    std::ostream::operator<<((ostream *)pSVar20->m_streams[pSVar20->m_verbosity],local_2594);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar20->m_streams[pSVar20->m_verbosity]," ignored",8);
    cVar3 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18)
                    + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    (*local_25b0->spxout->_vptr_SPxOut[2])(local_25b0->spxout,&local_21e8);
  }
  *local_25e0 = 0;
  local_2538 = local_25e0;
  pbVar29 = local_25e0;
  goto LAB_00160700;
LAB_00161eb6:
  if ((uint)local_25a0 != 0) {
    if ((uint)local_25a0 == 0x3e) {
      pcVar30 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar30,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2588.ld);
    }
    else if ((uint)local_25a0 == 0x3c) {
      pcVar30 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar30,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2588.ld);
    }
    else {
      pcVar30 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar30,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2588.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar30 + 1,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_2568.ld);
      pcVar30 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar30,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2588.ld);
    }
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar30 + 1,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_2568.ld);
  }
  pbVar31 = local_25e0;
  local_25e8._0_1_ = *local_25e0;
  iVar27 = tolower((int)(char)(byte)local_25e8);
  if ((((iVar27 == 0x66) && (iVar27 = tolower((int)(char)pbVar31[1]), iVar27 == 0x72)) &&
      (iVar27 = tolower((int)(char)pbVar31[2]), iVar27 == 0x65)) &&
     (iVar27 = tolower((int)(char)pbVar31[3]), iVar27 == 0x65)) {
    ::soplex::infinity::__tls_init();
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)(local_2390.low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12),local_2434);
    ::soplex::infinity::__tls_init();
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)(local_2390.up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12),local_2440);
    local_25e0 = pbVar31 + 4;
    pbVar31 = local_25d0;
    p_input = local_25b8;
  }
  else {
    pNVar28 = local_2590;
    if (2 < (byte)((byte)local_25e8 - 0x3c)) {
      local_25e8 = local_2538;
      pbVar31 = local_25d0;
      p_input = local_25b8;
      if (!bVar9) goto LAB_0016278a;
      goto LAB_00161e5b;
    }
    local_25e0 = pbVar31 + 1;
    bVar34 = pbVar31[1];
    bVar22 = bVar34;
    if (((bVar34 == 0x3c) || (bVar34 == 0x3e)) ||
       (lVar16 = 1, bVar22 = (byte)local_25e8, bVar34 == 0x3d)) {
      local_25e8._0_1_ = bVar22;
      local_25e0 = pbVar31 + 2;
      bVar34 = pbVar31[2];
      lVar16 = 2;
    }
    uVar23 = (uint)bVar34;
    if ((bVar34 < 0x21) && ((0x100002600U >> ((ulong)bVar34 & 0x3f) & 1) != 0)) {
      local_25e0 = pbVar31 + lVar16 + 1;
      uVar23 = (uint)*local_25e0;
    }
    pbVar31 = local_25e0;
    bVar34 = (byte)uVar23;
    if ((9 < (byte)(bVar34 - 0x30)) &&
       ((0x2e < bVar34 || ((0x680000000000U >> ((ulong)uVar23 & 0x3f) & 1) == 0))))
    goto LAB_0016278a;
    if (((bVar34 == 0x2d) || (uVar23 == 0x2b)) &&
       (((iVar27 = tolower((int)(char)local_25e0[1]), iVar27 == 0x69 &&
         (iVar27 = tolower((int)(char)pbVar31[2]), iVar27 == 0x6e)) &&
        (iVar27 = tolower((int)(char)pbVar31[3]), iVar27 == 0x66)))) {
      LPFreadInfinity((Rational *)&local_21e8.ld,(char **)&local_25e0);
    }
    else {
      LPFreadValue((Rational *)&local_21e8.ld,(char **)&local_25e0,local_25b0->spxout,local_2594);
    }
    if ((local_2573 == '\0') && (local_2572 == '\0')) {
      operator_delete(local_2588.ld.data,(local_2588.la[0] & 0xffffffff) << 3);
    }
    local_2578 = local_21d8;
    local_2574 = (undefined1)local_21d4;
    local_2573 = local_21d4._1_1_;
    local_2572 = local_21d2;
    if (local_21d4._1_1_ == '\x01') {
      memcpy(&local_2588,&local_21e8,(ulong)local_21d8 << 3);
    }
    else {
      local_2588.la[0] = local_21e8.la[0];
      local_2588.ld.data = local_21e8.ld.data;
      local_21d8 = 0;
      local_21d4 = CONCAT11(1,(undefined1)local_21d4);
    }
    if ((local_2553 == '\0') && (local_2552 == 0)) {
      operator_delete(local_2568.ld.data,(local_2568.la[0] & 0xffffffff) << 3);
    }
    bVar34 = local_21b2;
    local_2558 = local_21b8;
    local_2554 = (undefined1)local_21b4;
    cVar3 = local_21b4._1_1_;
    local_2553 = local_21b4._1_1_;
    local_2552 = local_21b2;
    if (local_21b4._1_1_ == '\0') {
      local_2568.la[0] = local_21c8.la[0];
      local_2568.ld.data = local_21c8.ld.data;
      local_21b8 = 0;
      local_21b4 = CONCAT11(1,(undefined1)local_21b4);
    }
    else {
      memcpy(&local_2568,&local_21c8,(ulong)local_21b8 << 3);
      if ((cVar3 == '\0') && (bVar34 == 0)) {
        operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
      }
    }
    if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
      operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
    }
    if ((byte)local_25e8 == 0x3e) {
      pcVar30 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar30,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2588.ld);
      p_input = local_25b8;
      pbVar31 = local_25d0;
      local_25a0 = CONCAT44(local_25a0._4_4_,0x3e);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar30 + 1,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_2568.ld);
      local_25e8 = local_2538;
      goto LAB_00161e5b;
    }
    if ((byte)local_25e8 == 0x3c) {
      pcVar30 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar30,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2588.ld);
      p_input = local_25b8;
      pbVar31 = local_25d0;
      local_25a0 = CONCAT44(local_25a0._4_4_,0x3c);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar30 + 1,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_2568.ld);
      local_25e8 = local_2538;
      goto LAB_00161e5b;
    }
    pcVar30 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)(local_2390.low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar12);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar30,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2588.ld);
    p_input = local_25b8;
    pbVar31 = local_25d0;
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar30 + 1,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_2568.ld);
    pcVar30 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)(local_2390.up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar12);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar30,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2588.ld);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar30 + 1,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_2568.ld);
    local_25a0 = CONCAT44(local_25a0._4_4_,(uint)(byte)local_25e8);
  }
  local_25e8 = local_2538;
LAB_00161e5b:
  local_25a4 = (uint)local_25a0;
  pbVar29 = local_25e0;
  pNVar28 = local_2590;
  pbVar35 = local_25e0;
  if (local_25e0 == local_25e8) {
LAB_0016278a:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ELPFRD15 Syntax error in line ",0x1e);
    plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cerr,local_2594);
    std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
    std::ostream::put((char)plVar13);
    std::ostream::flush();
    bVar34 = 0;
LAB_001627de:
    if (pNVar28 == (NameSet *)0x0) {
      free(local_2540);
      local_2540 = (NameSet *)0x0;
    }
    if (local_2448 == (NameSet *)0x0) {
      free(local_2510);
      local_2510 = (NameSet *)0x0;
    }
    free(local_2528);
    local_2528 = (byte *)0x0;
    free(local_2530);
    local_2530 = (char *)0x0;
    free(local_2518);
LAB_0016285a:
    if ((local_2553 == '\0') && (local_2552 == 0)) {
      operator_delete(local_2568.ld.data,(local_2568.la[0] & 0xffffffff) << 3);
    }
    if ((local_2573 == '\0') && (local_2572 == '\0')) {
      operator_delete(local_2588.ld.data,(local_2588.la[0] & 0xffffffff) << 3);
    }
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~DSVectorBase(&local_24b8);
    LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~LPRowBase(&local_22c8);
    LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~LPColBase(&local_118);
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~LPRowSetBase(&local_1e0);
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~LPColSetBase(&local_2390);
    return (bool)(bVar34 & 1);
  }
  goto LAB_001606f0;
LAB_00161d2f:
  if (*(int *)((long)&((local_24b8.
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       .m_elem)->val).m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data + lVar16) != iVar27) goto code_r0x00161d39;
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator+=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_2588.ld,
               (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)((long)local_24b8.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         .m_elem - lVar33));
  local_2508.la[0] = 0;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)&local_21e8.ld,(longlong *)local_2508.la,(type *)0x0);
  iVar26 = boost::multiprecision::backends::
           rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
           ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_2588.ld,
                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_21e8.ld);
  if ((local_21b4._1_1_ == '\0') && (local_21b2 == 0)) {
    operator_delete(local_21c8.ld.data,(local_21c8.la[0] & 0xffffffff) << 3);
  }
  if ((local_21d4._1_1_ == '\0') && (local_21d2 == '\0')) {
    operator_delete(local_21e8.ld.data,(local_21e8.la[0] & 0xffffffff) << 3);
  }
  if (iVar26 == 0) {
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::remove(&local_24b8.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ,pcVar15);
  }
  else {
    pcVar30 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)((long)local_24b8.
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        .m_elem - lVar33);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar30,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2588.ld);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar30 + 1,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_2568.ld);
  }
  pSVar20 = local_25b0->spxout;
  if ((pSVar20 != (SPxOut *)0x0) && (0 < (int)pSVar20->m_verbosity)) {
    local_21e8.ld.capacity = pSVar20->m_verbosity;
    local_2508.ld.capacity = 1;
    (*pSVar20->_vptr_SPxOut[2])(pSVar20,&local_2508);
    pSVar20 = soplex::operator<<(local_25b0->spxout,"WLPFRD10 Duplicate index ");
    pSVar20 = soplex::operator<<(pSVar20,local_2540->mem +
                                         (local_2540->set).theitem
                                         [(local_2540->set).thekey[iVar27].idx].data);
    pSVar20 = soplex::operator<<(pSVar20," in line ");
    std::ostream::operator<<((ostream *)pSVar20->m_streams[pSVar20->m_verbosity],local_2594);
    std::endl<char,std::char_traits<char>>(pSVar20->m_streams[pSVar20->m_verbosity]);
    (*local_25b0->spxout->_vptr_SPxOut[2])(local_25b0->spxout,&local_21e8);
  }
LAB_00161e0f:
  local_25d4 = 0;
  pbVar31 = local_25d0;
  p_input = local_25b8;
  goto LAB_00161e21;
code_r0x00161d39:
  lVar33 = lVar33 + -0x50;
  pcVar15 = (char *)(ulong)((int)pcVar15 + 1);
  lVar16 = lVar16 + 0x50;
  if ((long)local_24b8.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .memused * 0x50 + lVar33 == 0) goto LAB_00161d4b;
  goto LAB_00161d2f;
LAB_00161d4b:
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::add(&local_24b8,iVar27,
        (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
         *)&local_2588.ld);
LAB_00161d60:
  local_25d4 = 0;
LAB_00161e21:
  pbVar29 = local_25e0;
  bVar34 = *local_25e0;
  if ((byte)(bVar34 - 0x3c) < 3) {
    bVar22 = local_25e0[1];
    bVar8 = bVar22;
    if (((bVar22 == 0x3c) || (bVar22 == 0x3e)) ||
       (lVar16 = 1, bVar8 = bVar34, pbVar35 = local_25e0 + 1, bVar22 == 0x3d)) {
      bVar34 = bVar8;
      bVar22 = local_25e0[2];
      lVar16 = 2;
      pbVar35 = local_25e0 + 2;
    }
    local_25e0 = pbVar35;
    if ((bVar22 < 0x21) && ((0x100002600U >> ((ulong)bVar22 & 0x3f) & 1) != 0)) {
      local_25e0 = pbVar29 + lVar16 + 1;
    }
    local_25a4 = (uint)bVar34;
  }
  else {
LAB_00161e53:
  }
  local_25a0 = CONCAT44(local_25a0._4_4_,local_25a4);
  goto LAB_00161e5b;
}

Assistant:

inline
bool SPxLPBase<Rational>::readLPF(
   std::istream& p_input,                ///< input stream.
   NameSet*      p_rnames,               ///< row names.
   NameSet*      p_cnames,               ///< column names.
   DIdxSet*      p_intvars)              ///< integer variables.
{
   enum
   {
      START, OBJECTIVE, CONSTRAINTS, BOUNDS, INTEGERS, BINARIES
   } section = START;

   NameSet* rnames;                      ///< row names.
   NameSet* cnames;                      ///< column names.

   LPColSetBase<Rational> cset;              ///< the set of columns read.
   LPRowSetBase<Rational> rset;              ///< the set of rows read.
   LPColBase<Rational> emptycol;             ///< reusable empty column.
   LPRowBase<Rational> row;                  ///< last assembled row.
   DSVectorBase<Rational> vec;               ///< last assembled vector (from row).

   Rational val = 1;
   int colidx;
   int sense = 0;

   int lineno = 0;
   bool unnamed = true;
   bool finished = false;
   bool other;
   bool have_value = true;
   int i;
   int k;
   int buf_size;
   int buf_pos;
   char* buf = nullptr;
   char* tmp = nullptr;
   char* line = nullptr;
   char* s = nullptr;
   char* pos = nullptr;
   char* pos_old = nullptr;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<Rational>::clear(); // clear the LP.

   //--------------------------------------------------------------------------
   //--- Main Loop
   //--------------------------------------------------------------------------
   buf_size = SOPLEX_LPF_MAX_LINE_LEN;
   spx_alloc(buf, buf_size);
   spx_alloc(tmp, buf_size);
   spx_alloc(line, buf_size);

   for(;;)
   {
      buf_pos = 0;

      while(!p_input.getline(buf + buf_pos, buf_size - buf_pos))
      {
         p_input.clear();

         if(strlen(buf) == (size_t) buf_size - 1)
         {
            buf_pos = buf_size - 1;
            buf_size = buf_size + SOPLEX_LPF_MAX_LINE_LEN;

            if(buf_size >= INT_MAX)
            {
               SPX_MSG_ERROR(std::cerr << "ELPFRD16 Line longer than INT_MAX" << std::endl;)
               goto syntax_error;
            }

            spx_realloc(buf, buf_size);
         }
         else
         {
            SPX_MSG_ERROR(std::cerr << "ELPFRD07 No 'End' marker found" << std::endl;)
            finished = true;
            break;
         }
      }

      if(finished)
         break;

      if((size_t) buf_size > sizeof(tmp))
      {
         spx_realloc(tmp, buf_size);
         spx_realloc(line, buf_size);
      }

      lineno++;
      i   = 0;
      pos = buf;

      SPxOut::debug(spxout, "DLPFRD08 Reading line {} (pos={})\n", lineno, pos);

      // 1. Remove comments.
      if(nullptr != (s = strchr(buf, '\\')))
         * s = '\0';

      // 2. Look for keywords.
      if(section == START)
      {
         if(LPFhasKeyword(pos, "max[imize]"))
         {
            changeSense(SPxLPBase<Rational>::MAXIMIZE);
            section = OBJECTIVE;
         }
         else if(LPFhasKeyword(pos, "min[imize]"))
         {
            changeSense(SPxLPBase<Rational>::MINIMIZE);
            section = OBJECTIVE;
         }
      }
      else if(section == OBJECTIVE)
      {
         if(LPFhasKeyword(pos, "s[ubject][   ]t[o]")
               || LPFhasKeyword(pos, "s[uch][    ]t[hat]")
               || LPFhasKeyword(pos, "s[.][    ]t[.]")
               || LPFhasKeyword(pos, "lazy con[straints]"))
         {
            // store objective vector
            for(int j = vec.size() - 1; j >= 0; --j)
               cset.maxObj_w(vec.index(j)) = vec.value(j);

            // multiplication with -1 for minimization is done below
            vec.clear();
            have_value = true;
            val = 1;
            section = CONSTRAINTS;
         }
      }
      else if(section == CONSTRAINTS &&
              (LPFhasKeyword(pos, "s[ubject][   ]t[o]")
               || LPFhasKeyword(pos, "s[uch][    ]t[hat]")
               || LPFhasKeyword(pos, "s[.][    ]t[.]")))
      {
         have_value = true;
         val = 1;
      }
      else
      {
         if(LPFhasKeyword(pos, "lazy con[straints]"))
            ;
         else if(LPFhasKeyword(pos, "bound[s]"))
            section = BOUNDS;
         else if(LPFhasKeyword(pos, "bin[ary]"))
            section = BINARIES;
         else if(LPFhasKeyword(pos, "bin[aries]"))
            section = BINARIES;
         else if(LPFhasKeyword(pos, "gen[erals]"))
            section = INTEGERS;
         else if(LPFhasKeyword(pos, "int[egers]"))   // this is undocumented
            section = INTEGERS;
         else if(LPFhasKeyword(pos, "end"))
         {
            finished = true;
            break;
         }
         else if(LPFhasKeyword(pos, "s[ubject][   ]t[o]")  // second time
                 || LPFhasKeyword(pos, "s[uch][    ]t[hat]")
                 || LPFhasKeyword(pos, "s[.][    ]t[.]")
                 || LPFhasKeyword(pos, "lazy con[straints]"))
         {
            // In principle this has to checked for all keywords above,
            // otherwise we just ignore any half finished constraint
            if(have_value)
               goto syntax_error;

            have_value = true;
            val = 1;
         }
      }

      // 3a. Look for row names in objective and drop it.
      if(section == OBJECTIVE)
         LPFhasRowName(pos, nullptr);

      // 3b. Look for row name in constraint and store it.
      if(section == CONSTRAINTS)
         if(LPFhasRowName(pos, rnames))
            unnamed = false;

      // 4a. Remove initial spaces.
      while(LPFisSpace(pos[i]))
         i++;

      // 4b. remove spaces if they do not appear before the name of a vaiable.
      for(k = 0; pos[i] != '\0'; i++)
         if(!LPFisSpace(pos[i]) || LPFisColName(&pos[i + 1]))
            tmp[k++] = pos[i];

      tmp[k] = '\0';

      // 5. Is this an empty line ?
      if(tmp[0] == '\0')
         continue;

      // 6. Collapse sequences of '+' and '-'. e.g ++---+ => -
      for(i = 0, k = 0; tmp[i] != '\0'; i++)
      {
         while(((tmp[i] == '+') || (tmp[i] == '-')) && ((tmp[i + 1] == '+') || (tmp[i + 1] == '-')))
         {
            if(tmp[i++] == '-')
               tmp[i] = (tmp[i] == '-') ? '+' : '-';
         }

         line[k++] = tmp[i];
      }

      line[k] = '\0';

      //-----------------------------------------------------------------------
      //--- Line processing loop
      //-----------------------------------------------------------------------
      pos = line;

      SPxOut::debug(spxout, "DLPFRD09 pos= {}\n", pos);

      // 7. We have something left to process.
      while((pos != nullptr) && (*pos != '\0'))
      {
         // remember our position, so we are sure we make progress.
         pos_old = pos;

         // now process the sections
         switch(section)
         {
         case OBJECTIVE:
            if(LPFisValue(pos))
            {
               Rational pre_sign = 1;

               /* Already having here a value could only result from being the first number in a constraint, or a sign
                * '+' or '-' as last token on the previous line.
                */
               if(have_value)
               {
                  if(spxAbs(val) != 1)
                     goto syntax_error;

                  if(val == -1)
                     pre_sign = val;
               }

               have_value = true;
               val = LPFreadValue(pos, spxout, lineno);
               val *= pre_sign;
            }

            if(*pos == '\0')
               continue;

            if(!have_value || !LPFisColName(pos))
               goto syntax_error;

            have_value = false;
            colidx = LPFreadColName(pos, cnames, cset, &emptycol, spxout);
            vec.add(colidx, val);
            break;

         case CONSTRAINTS:
            if(LPFisValue(pos))
            {
               Rational pre_sign = 1;

               /* Already having here a value could only result from being the first number in a constraint, or a sign
                * '+' or '-' as last token on the previous line.
                */
               if(have_value)
               {
                  if(spxAbs(val) != 1)
                     goto syntax_error;

                  if(val == -1)
                     pre_sign = val;
               }

               have_value = true;
               val = LPFreadValue(pos, spxout, lineno);
               val *= pre_sign;

               if(sense != 0)
               {
                  if(sense == '<')
                  {
                     row.setLhs(-infinity);
                     row.setRhs(val);
                  }
                  else if(sense == '>')
                  {
                     row.setLhs(val);
                     row.setRhs(infinity);
                  }
                  else
                  {
                     assert(sense == '=');

                     row.setLhs(val);
                     row.setRhs(val);
                  }

                  row.setRowVector(vec);
                  rset.add(row);
                  vec.clear();

                  if(!unnamed)
                     unnamed = true;
                  else
                  {
                     char name[16];
                     spxSnprintf(name, 16, "C%d", rset.num());
                     rnames->add(name);
                  }

                  have_value = true;
                  val = 1;
                  sense = 0;
                  pos = nullptr;
                  // next line
                  continue;
               }
            }

            if(*pos == '\0')
               continue;

            if(have_value)
            {
               if(LPFisColName(pos))
               {
                  colidx = LPFreadColName(pos, cnames, cset, &emptycol, spxout);

                  if(val != 0)
                  {
                     // Do we have this index already in the row?
                     int n = vec.pos(colidx);

                     // if not, add it
                     if(n < 0)
                        vec.add(colidx, val);
                     // if yes, add them up and remove the element if it amounts to zero
                     else
                     {
                        assert(vec.index(n) == colidx);

                        val += vec.value(n);

                        if(val == 0)
                           vec.remove(n);
                        else
                           vec.value(n) = val;

                        assert(cnames->has(colidx));

                        SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WLPFRD10 Duplicate index "
                                        << (*cnames)[colidx]
                                        << " in line " << lineno
                                        << std::endl;)
                     }
                  }

                  have_value = false;
               }
               else
               {
                  // We have a row like c1: <= 5 with no variables. We can not handle 10 <= 5; issue a syntax error.
                  if(val != 1)
                     goto syntax_error;

                  // If the next thing is not the sense we give up also.
                  if(!LPFisSense(pos))
                     goto syntax_error;

                  have_value = false;
               }
            }

            assert(!have_value);

            if(LPFisSense(pos))
               sense = LPFreadSense(pos);

            break;

         case BOUNDS:
            other = false;
            sense = 0;

            if(LPFisValue(pos))
            {
               val = LPFisInfinity(pos) ? LPFreadInfinity(pos) : LPFreadValue(pos, spxout, lineno);

               if(!LPFisSense(pos))
                  goto syntax_error;

               sense = LPFreadSense(pos);
               other = true;
            }

            if(!LPFisColName(pos))
               goto syntax_error;

            if((colidx = LPFreadColName(pos, cnames, cset, nullptr, spxout)) < 0)
            {
               SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WLPFRD11 in Bounds section line "
                               << lineno << " ignored" << std::endl;)
               *pos = '\0';
               continue;
            }

            if(sense)
            {
               if(sense == '<')
                  cset.lower_w(colidx) = val;
               else if(sense == '>')
                  cset.upper_w(colidx) = val;
               else
               {
                  assert(sense == '=');
                  cset.lower_w(colidx) = val;
                  cset.upper_w(colidx) = val;
               }
            }

            if(LPFisFree(pos))
            {
               cset.lower_w(colidx) = -infinity;
               cset.upper_w(colidx) =  infinity;
               other = true;
               pos += 4;  // set position after the word "free"
            }
            else if(LPFisSense(pos))
            {
               sense = LPFreadSense(pos);
               other = true;

               if(!LPFisValue(pos))
                  goto syntax_error;

               val = LPFisInfinity(pos) ? LPFreadInfinity(pos) : LPFreadValue(pos,  spxout, lineno);

               if(sense == '<')
                  cset.upper_w(colidx) = val;
               else if(sense == '>')
                  cset.lower_w(colidx) = val;
               else
               {
                  assert(sense == '=');
                  cset.lower_w(colidx) = val;
                  cset.upper_w(colidx) = val;
               }
            }

            /* Do we have only a single column name in the input line?  We could ignore this savely, but it is probably
             * a sign of some other error.
             */
            if(!other)
               goto syntax_error;

            break;

         case BINARIES:
         case INTEGERS:
            if((colidx = LPFreadColName(pos, cnames, cset, nullptr, spxout)) < 0)
            {
               SPX_MSG_WARNING((*this->spxout),
                               (*this->spxout) << "WLPFRD12 in Binary/General section line " << lineno
                               << " ignored" << std::endl;)
            }
            else
            {
               if(section == BINARIES)
               {
                  if(cset.lower(colidx) < 0)
                  {
                     cset.lower_w(colidx) = 0;
                  }

                  if(cset.upper(colidx) > 1)
                  {
                     cset.upper_w(colidx) = 1;
                  }
               }

               if(p_intvars != nullptr)
                  p_intvars->addIdx(colidx);
            }

            break;

         case START:
            SPX_MSG_ERROR(std::cerr << "ELPFRD13 This seems to be no LP format file" << std::endl;)
            goto syntax_error;

         default:
            throw SPxInternalCodeException("XLPFRD01 This should never happen.");
         }

         if(pos == pos_old)
            goto syntax_error;
      }
   }

   assert(isConsistent());

   addCols(cset);
   assert(isConsistent());

   addRows(rset);
   assert(isConsistent());

syntax_error:

   if(finished)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Finished reading " << lineno << " lines" <<
                    std::endl;)
   }
   else
      SPX_MSG_ERROR(std::cerr << "ELPFRD15 Syntax error in line " << lineno << std::endl;)

      if(p_cnames == nullptr)
         spx_free(cnames);

   if(p_rnames == nullptr)
      spx_free(rnames);

   spx_free(buf);
   spx_free(tmp);
   spx_free(line);

   return finished;
}